

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall
ON_NurbsSurface::Create
          (ON_NurbsSurface *this,int dim,bool is_rat,int order0,int order1,int cv_count0,
          int cv_count1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (cv_count1 < order1 || ((cv_count0 < order0 || order1 < 2) || (order0 < 2 || dim < 1))) {
    bVar3 = false;
  }
  else {
    this->m_dim = dim;
    this->m_is_rat = (uint)is_rat;
    this->m_order[0] = order0;
    this->m_order[1] = order1;
    this->m_cv_count[0] = cv_count0;
    this->m_cv_count[1] = cv_count1;
    iVar4 = (uint)is_rat + dim;
    this->m_cv_stride[1] = iVar4;
    this->m_cv_stride[0] = iVar4 * cv_count1;
    iVar4 = ON_KnotCount(order0,cv_count0);
    bVar1 = ReserveKnotCapacity(this,0,iVar4);
    iVar4 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
    bVar2 = ReserveKnotCapacity(this,1,iVar4);
    bVar3 = ReserveCVCapacity(this,this->m_cv_count[1] * this->m_cv_count[0] * this->m_cv_stride[1])
    ;
    bVar3 = bVar3 && (bVar2 && bVar1);
  }
  return bVar3;
}

Assistant:

bool ON_NurbsSurface::Create(
        int dim,      // dimension (>= 1)
        bool is_rat,  // true to make a rational NURBS
        int order0,    // order (>= 2)
        int order1,    // order (>= 2)
        int cv_count0,  // cv count0 (>= order0)
        int cv_count1   // cv count1 (>= order1)
        )
{
  DestroySurfaceTree();
  if ( dim < 1 )
    return false;
  if ( order0 < 2 )
    return false;
  if ( order1 < 2 )
    return false;
  if ( cv_count0 < order0 )
    return false;
  if ( cv_count1 < order1 )
    return false;
  m_dim = dim;
  m_is_rat = (is_rat) ? true : false;
  m_order[0] = order0;
  m_order[1] = order1;
  m_cv_count[0] = cv_count0;
  m_cv_count[1] = cv_count1;
  m_cv_stride[1] = (m_is_rat) ? m_dim+1 : m_dim;
  m_cv_stride[0] = m_cv_stride[1]*m_cv_count[1];
  bool rc = ReserveKnotCapacity( 0, KnotCount(0) );
  if ( !ReserveKnotCapacity( 1, KnotCount(1) ) )
    rc = false;
  if ( !ReserveCVCapacity( m_cv_count[0]*m_cv_count[1]*m_cv_stride[1] ) )
    rc = false;
  return rc;
}